

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirIfInternal(char *dirName,aint val)

{
  aint aVar1;
  bool bVar2;
  EReturn EVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  aint val_local;
  char errorsTxt [2] [48];
  
  val_local = val;
  for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 0x30) {
    snprintf(errorsTxt[0] + lVar5,0x30,dirIfErrorsTxtSrc[0] + lVar5,dirName);
  }
  iVar4 = 0;
  ListFile(false);
  EVar3 = END;
  uVar6 = 0;
  while( true ) {
    while( true ) {
      do {
        aVar1 = val_local;
        if (EVar3 == ENDIF) {
          return;
        }
        if (val_local == 0) {
          EVar3 = SkipFile();
        }
        else {
          EVar3 = ReadFile();
        }
        uVar6 = uVar6 | aVar1;
      } while (EVar3 == ENDIF);
      if (EVar3 != ELSEIF) break;
      bVar2 = val_local == 0;
      val_local = (aint)(bVar2 && uVar6 == 0);
      if (bVar2 && uVar6 == 0) {
        bVar2 = dirIfIfn(&val_local);
        uVar6 = 0;
        if (!bVar2) {
          val_local = 0;
          uVar6 = 1;
        }
      }
    }
    if (EVar3 != ELSE) break;
    if (iVar4 != 0) {
      Error(errorsTxt[1],(char *)0x0,PASS3);
    }
    iVar4 = iVar4 + 1;
    val_local = (aint)(val_local == 0 && uVar6 == 0);
  }
  if (IsRunning != 0) {
    Error(errorsTxt[0],(char *)0x0,PASS3);
    donotlist = (uint)(IsRunning == 0);
    return;
  }
  donotlist = 1;
  return;
}

Assistant:

static void dirIfInternal(const char* dirName, aint val) {
	// set up error messages for the particular pseudo-op
	char errorsTxt[dirIfErrorsN][dirIfErrorsSZ];
	for (size_t i = 0; i < dirIfErrorsN; ++i) {
		SPRINTF1(errorsTxt[i], dirIfErrorsSZ, dirIfErrorsTxtSrc[i], dirName);
	}
	// do the IF**some** part
	ListFile();
	EReturn ret = END;
	aint elseCounter = 0;
	aint orVal = false;
	while (ENDIF != ret) {
		orVal |= val;
		switch (ret = val ? ReadFile() : SkipFile()) {
			case ELSE:
				if (elseCounter++) Error(errorsTxt[1]);
				val = !val && !orVal;
				break;
			case ELSEIF:
				val = !val && !orVal;
				if (val) {		// active ELSEIF, evaluate expression
					if (!dirIfIfn(val)) {
						val = false;		// syntax error in expression
						orVal = true;		// force remaining IF-blocks inactive
					}
				}
				break;
			case ENDIF:
				break;
			default:
				if (IsRunning) Error(errorsTxt[0]);
				donotlist=!IsRunning;		// do the listing only if still running
				return;
		}
	}
}